

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_NodeMffcSize(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x46f,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar3 = ~*(uint *)pNode;
  if (((uVar3 & 0x9fffffff) != 0) && ((int)*(uint *)pNode < 0 || (uVar3 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x470,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_NodeDeref_rec(p,pNode);
  iVar2 = Gia_NodeRef_rec(p,pNode);
  if (iVar1 != iVar2) {
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x473,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (-1 < iVar1) {
    return iVar1;
  }
  __assert_fail("ConeSize1 >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x474,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeMffcSize( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    int ConeSize1, ConeSize2;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsCand(pNode) );
    ConeSize1 = Gia_NodeDeref_rec( p, pNode );
    ConeSize2 = Gia_NodeRef_rec( p, pNode );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 >= 0 );
    return ConeSize1;
}